

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O0

void __thiscall SslUdpSocketImpl::SslUdpSocketImpl(SslUdpSocketImpl *this,BaseSocket *pBkRef)

{
  SslUdpSocketImpl *local_88;
  code *local_80;
  undefined8 local_78;
  type local_70;
  SslUdpSocketImpl *local_48;
  code *local_40;
  undefined8 local_38;
  type local_30;
  BaseSocket *local_18;
  BaseSocket *pBkRef_local;
  SslUdpSocketImpl *this_local;
  
  local_18 = pBkRef;
  pBkRef_local = (BaseSocket *)this;
  UdpSocketImpl::UdpSocketImpl(&this->super_UdpSocketImpl,pBkRef);
  (this->super_UdpSocketImpl).super_BaseSocketImpl._vptr_BaseSocketImpl =
       (_func_int **)&PTR__SslUdpSocketImpl_001b7f60;
  OpenSSLWrapper::SslUdpContext::SslUdpContext(&this->m_pUdpCtx);
  std::unique_ptr<OpenSSLWrapper::SslConnection,std::default_delete<OpenSSLWrapper::SslConnection>>
  ::unique_ptr<std::default_delete<OpenSSLWrapper::SslConnection>,void>
            ((unique_ptr<OpenSSLWrapper::SslConnection,std::default_delete<OpenSSLWrapper::SslConnection>>
              *)&this->m_pSslCon);
  std::function<void_(UdpSocket_*)>::function(&this->m_fSllInitDone);
  std::function<void_(UdpSocket_*,_void_*)>::function(&this->m_fSllInitDoneParam);
  this->m_bCloseReq = false;
  std::__cxx11::string::string((string *)&this->m_strDestAddr);
  std::mutex::mutex(&this->m_mxEnDecode);
  local_40 = DatenEncode;
  local_38 = 0;
  local_48 = this;
  std::
  bind<int(SslUdpSocketImpl::*)(unsigned_char_const*,unsigned_long,std::__cxx11::string_const&),SslUdpSocketImpl*,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&>
            (&local_30,(offset_in_SslUdpSocketImpl_to_subr *)&local_40,&local_48,
             (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2,
             (_Placeholder<3> *)&std::placeholders::_3);
  std::function<int(unsigned_char_const*,unsigned_long,std::__cxx11::string_const&)>::operator=
            ((function<int(unsigned_char_const*,unsigned_long,std::__cxx11::string_const&)> *)
             &(this->super_UdpSocketImpl).m_fnSslEncode,&local_30);
  local_80 = DatenDecode;
  local_78 = 0;
  local_88 = this;
  std::
  bind<int(SslUdpSocketImpl::*)(unsigned_char_const*,unsigned_long,std::__cxx11::string_const&),SslUdpSocketImpl*,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&>
            (&local_70,(offset_in_SslUdpSocketImpl_to_subr *)&local_80,&local_88,
             (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2,
             (_Placeholder<3> *)&std::placeholders::_3);
  std::function<int(unsigned_char_const*,unsigned_long,std::__cxx11::string_const&)>::operator=
            ((function<int(unsigned_char_const*,unsigned_long,std::__cxx11::string_const&)> *)
             &(this->super_UdpSocketImpl).m_fnSslDecode,&local_70);
  return;
}

Assistant:

SslUdpSocketImpl::SslUdpSocketImpl(BaseSocket* pBkRef) : UdpSocketImpl(pBkRef), m_bCloseReq(false)
{
    m_fnSslEncode = bind(&SslUdpSocketImpl::DatenEncode, this, _1, _2, _3);
    m_fnSslDecode = bind(&SslUdpSocketImpl::DatenDecode, this, _1, _2, _3);
}